

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CMU462::OSDText::~OSDText(OSDText *this)

{
  if (this->ft != (FT_Library *)0x0) {
    operator_delete(this->ft);
  }
  if (this->font != (char *)0x0) {
    operator_delete(this->font);
  }
  if (this->face != (FT_Face_conflict *)0x0) {
    operator_delete(this->face);
  }
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::clear(&this->lines);
  (*__glewDeleteProgram)(this->program);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete font;
  delete face;

  lines.clear();

  glDeleteProgram(program);
}